

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O1

bool __thiscall
glslang::HlslGrammar::acceptParenExpression(HlslGrammar *this,TIntermTyped **expression)

{
  TIntermNode *pTVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  bool bVar4;
  char *pcVar5;
  TIntermNode *declNode;
  TIntermNode *local_30;
  
  *expression = (TIntermTyped *)0x0;
  bVar2 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftParen);
  if (!bVar2) {
    (*(this->parseContext->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this->parseContext,&(this->super_HlslTokenStream).token,"Expected","(","");
  }
  local_30 = (TIntermNode *)0x0;
  bVar2 = acceptControlDeclaration(this,&local_30);
  pTVar1 = local_30;
  if (bVar2) {
    pcVar5 = "initialized declaration";
    if ((local_30 != (TIntermNode *)0x0) &&
       (iVar3 = (*local_30->_vptr_TIntermNode[3])(local_30), CONCAT44(extraout_var,iVar3) != 0)) {
      iVar3 = (*pTVar1->_vptr_TIntermNode[3])(pTVar1);
      *expression = (TIntermTyped *)CONCAT44(extraout_var_00,iVar3);
LAB_003a7fa9:
      bVar2 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokRightParen);
      bVar4 = true;
      if (bVar2) {
        return true;
      }
      pcVar5 = ")";
      goto LAB_003a7fcf;
    }
  }
  else {
    bVar2 = acceptExpression(this,expression);
    if (bVar2) goto LAB_003a7fa9;
    pcVar5 = "expression";
  }
  bVar4 = false;
LAB_003a7fcf:
  (*(this->parseContext->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
            (this->parseContext,&(this->super_HlslTokenStream).token,"Expected",pcVar5,"");
  return bVar4;
}

Assistant:

bool HlslGrammar::acceptParenExpression(TIntermTyped*& expression)
{
    expression = nullptr;

    // LEFT_PAREN
    if (! acceptTokenClass(EHTokLeftParen))
        expected("(");

    bool decl = false;
    TIntermNode* declNode = nullptr;
    decl = acceptControlDeclaration(declNode);
    if (decl) {
        if (declNode == nullptr || declNode->getAsTyped() == nullptr) {
            expected("initialized declaration");
            return false;
        } else
            expression = declNode->getAsTyped();
    } else {
        // no declaration
        if (! acceptExpression(expression)) {
            expected("expression");
            return false;
        }
    }

    // RIGHT_PAREN
    if (! acceptTokenClass(EHTokRightParen))
        expected(")");

    return true;
}